

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void GenStateInitBlock(jx9_gen_state *pGen,GenBlock *pBlock,sxi32 iType,sxu32 nFirstInstr,
                      void *pUserData)

{
  void *pUserData_local;
  sxu32 nFirstInstr_local;
  sxi32 iType_local;
  GenBlock *pBlock_local;
  jx9_gen_state *pGen_local;
  
  pBlock->nFirstInstr = nFirstInstr;
  pBlock->pUserData = pUserData;
  pBlock->pGen = pGen;
  pBlock->iFlags = iType;
  pBlock->pParent = (GenBlock *)0x0;
  pBlock->bPostContinue = '\0';
  SySetInit(&pBlock->aJumpFix,&pGen->pVm->sAllocator,8);
  SySetInit(&pBlock->aPostContFix,&pGen->pVm->sAllocator,8);
  return;
}

Assistant:

static void GenStateInitBlock(
	jx9_gen_state *pGen, /* Code generator state */
	GenBlock *pBlock,    /* Target block */
	sxi32 iType,         /* Block type [i.e: loop, conditional, function body, etc.]*/
	sxu32 nFirstInstr,   /* First instruction to compile */
	void *pUserData      /* Upper layer private data */
	)
{
	/* Initialize block fields */
	pBlock->nFirstInstr = nFirstInstr;
	pBlock->pUserData   = pUserData;
	pBlock->pGen        = pGen;
	pBlock->iFlags      = iType;
	pBlock->pParent     = 0;
	pBlock->bPostContinue = 0;
	SySetInit(&pBlock->aJumpFix, &pGen->pVm->sAllocator, sizeof(JumpFixup));
	SySetInit(&pBlock->aPostContFix, &pGen->pVm->sAllocator, sizeof(JumpFixup));
}